

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLUnknown * __thiscall tinyxml2::XMLDocument::NewUnknown(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  XMLUnknown *unk;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = &CreateUnlinkedNode<tinyxml2::XMLUnknown,104>(this,&this->_commentPool)->super_XMLNode;
  XMLNode::SetValue(this_00,str,false);
  return (XMLUnknown *)this_00;
}

Assistant:

XMLUnknown* XMLDocument::NewUnknown( const char* str )
{
    XMLUnknown* unk = CreateUnlinkedNode<XMLUnknown>( _commentPool );
    unk->SetValue( str );
    return unk;
}